

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O1

_Bool is_intersect_correct(roaring_bitmap_t *bitmap1,roaring_bitmap_t *bitmap2)

{
  _Bool _Var1;
  _Bool _Var2;
  uint64_t uVar3;
  roaring_bitmap_t *x1;
  roaring_bitmap_t *x1_00;
  
  uVar3 = roaring_bitmap_and_cardinality(bitmap1,bitmap2);
  _Var1 = roaring_bitmap_intersect(bitmap1,bitmap2);
  if (_Var1 == (uVar3 == 0)) {
    _Var1 = false;
  }
  else {
    x1 = roaring_bitmap_andnot(bitmap1,bitmap2);
    _Var2 = roaring_bitmap_intersect(x1,bitmap2);
    x1_00 = roaring_bitmap_or(bitmap1,bitmap2);
    _Var1 = roaring_bitmap_intersect(x1_00,bitmap2);
    _Var1 = _Var1 && !_Var2;
    roaring_bitmap_free(x1);
    roaring_bitmap_free(x1_00);
  }
  return _Var1;
}

Assistant:

bool is_intersect_correct(roaring_bitmap_t *bitmap1,
                          roaring_bitmap_t *bitmap2) {
    uint64_t c = roaring_bitmap_and_cardinality(bitmap1, bitmap2);
    if (roaring_bitmap_intersect(bitmap1, bitmap2) != (c > 0)) return false;
    roaring_bitmap_t *bitmap1minus2 = roaring_bitmap_andnot(bitmap1, bitmap2);
    bool answer = true;
    if (roaring_bitmap_intersect(bitmap1minus2, bitmap2)) {
        answer = false;
    }
    roaring_bitmap_t *bitmap1plus2 = roaring_bitmap_or(bitmap1, bitmap2);
    if (!roaring_bitmap_intersect(bitmap1plus2, bitmap2)) {
        answer = false;
    }
    roaring_bitmap_free(bitmap1minus2);
    roaring_bitmap_free(bitmap1plus2);
    return answer;
}